

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::Node::loadFinalSchema(Node *this,SchemaLoader *loader)

{
  Module *pMVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  Exception *in_RCX;
  char *pcVar5;
  Content *content;
  Content *local_300;
  Maybe<kj::Exception> local_2f8;
  Runnable local_190;
  Content **local_188;
  SchemaLoader *local_180;
  Node *local_178;
  char local_170;
  Exception local_168;
  
  local_300 = (Content *)getContent(this,FINISHED);
  if (local_300 != (Content *)0x0) {
    local_190._vptr_Runnable = (_func_int **)&PTR_run_002bd2f0;
    local_188 = &local_300;
    local_180 = loader;
    local_178 = this;
    kj::_::runCatchingExceptions(&local_2f8,&local_190);
    local_170 = local_2f8.ptr.isSet;
    if (local_2f8.ptr.isSet != false) {
      local_168.ownFile.content.ptr = local_2f8.ptr.field_1.value.ownFile.content.ptr;
      local_168.ownFile.content.size_ = local_2f8.ptr.field_1.value.ownFile.content.size_;
      local_168.ownFile.content.disposer = local_2f8.ptr.field_1.value.ownFile.content.disposer;
      local_2f8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      local_2f8.ptr.field_1.value.ownFile.content.size_ = 0;
      local_168.file = local_2f8.ptr.field_1.value.file;
      local_168.line = local_2f8.ptr.field_1.value.line;
      local_168.type = local_2f8.ptr.field_1.value.type;
      local_168.description.content.ptr = local_2f8.ptr.field_1.value.description.content.ptr;
      local_168.description.content.size_ = local_2f8.ptr.field_1.value.description.content.size_;
      local_2f8.ptr.field_1.value.description.content.ptr = (char *)0x0;
      local_2f8.ptr.field_1.value.description.content.size_ = 0;
      local_168.description.content.disposer =
           local_2f8.ptr.field_1.value.description.content.disposer;
      local_168.context.ptr.disposer = local_2f8.ptr.field_1.value.context.ptr.disposer;
      local_168.context.ptr.ptr = local_2f8.ptr.field_1.value.context.ptr.ptr;
      local_2f8.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      memcpy(local_168.trace,(undefined1 *)((long)&local_2f8.ptr.field_1.value + 0x50),0x104);
      kj::Exception::~Exception((Exception *)&local_2f8.ptr.field_1);
      if ((local_300->finalSchema).ptr.isSet == true) {
        (local_300->finalSchema).ptr.isSet = false;
      }
      iVar4 = (*(this->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
      if ((char)iVar4 == '\0') {
        kj::str<char_const(&)[50],kj::Exception&>
                  ((String *)&local_2f8,(kj *)"Internal compiler bug: Schema failed validation:\n",
                   (char (*) [50])&local_168,in_RCX);
        pcVar5 = (char *)local_2f8.ptr._0_8_;
        if (local_2f8.ptr.field_1.value.ownFile.content.ptr == (char *)0x0) {
          pcVar5 = "";
        }
        pMVar1 = this->module->parserModule;
        (**(pMVar1->super_ErrorReporter)._vptr_ErrorReporter)
                  (pMVar1,(ulong)this->startByte,(ulong)this->endByte,pcVar5,
                   local_2f8.ptr.field_1.value.ownFile.content.ptr +
                   (local_2f8.ptr.field_1.value.ownFile.content.ptr == (char *)0x0));
        uVar3 = local_2f8.ptr.field_1.value.ownFile.content.ptr;
        uVar2 = local_2f8.ptr._0_8_;
        if ((char *)local_2f8.ptr._0_8_ != (char *)0x0) {
          local_2f8.ptr._0_8_ = (char *)0x0;
          local_2f8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
          (*(code *)**(undefined8 **)local_2f8.ptr.field_1.value.ownFile.content.size_)
                    (local_2f8.ptr.field_1.value.ownFile.content.size_,uVar2,1,uVar3,uVar3,0);
        }
      }
    }
    if (local_170 == '\x01') {
      kj::Exception::~Exception(&local_168);
    }
  }
  return;
}

Assistant:

void Compiler::Node::loadFinalSchema(const SchemaLoader& loader) {
  KJ_IF_MAYBE(content, getContent(Content::FINISHED)) {
    KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&](){
      KJ_IF_MAYBE(finalSchema, content->finalSchema) {
        KJ_MAP(auxSchema, content->auxSchemas) {
          return loader.loadOnce(auxSchema);
        };
        loadedFinalSchema = loader.loadOnce(*finalSchema).getProto();
      }
    })) {
      // Schema validation threw an exception.

      // Don't try loading this again.
      content->finalSchema = nullptr;

      // Only bother to report validation failures if we think we haven't seen any errors.
      // Otherwise we assume that the errors caused the validation failure.
      if (!module->getErrorReporter().hadErrors()) {
        addError(kj::str("Internal compiler bug: Schema failed validation:\n", *exception));
      }
    }
  }
}